

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O0

TwoLevelStatus __thiscall
JPEGImageParser::ReadStreamToBuffer
          (JPEGImageParser *this,unsigned_long inAmountToRead,unsigned_long *refReadLimit)

{
  EStatusCode inPrimary;
  EStatusCode status;
  unsigned_long *refReadLimit_local;
  unsigned_long inAmountToRead_local;
  JPEGImageParser *this_local;
  
  if (*refReadLimit < inAmountToRead) {
    TwoLevelStatus::TwoLevelStatus((TwoLevelStatus *)&this_local,eSuccess,eFailure);
  }
  else {
    inPrimary = ReadStreamToBuffer(this,inAmountToRead);
    if (inPrimary == eSuccess) {
      *refReadLimit = *refReadLimit - inAmountToRead;
    }
    TwoLevelStatus::TwoLevelStatus((TwoLevelStatus *)&this_local,inPrimary,eSuccess);
  }
  return (TwoLevelStatus)this_local;
}

Assistant:

TwoLevelStatus JPEGImageParser::ReadStreamToBuffer(unsigned long inAmountToRead,unsigned long& refReadLimit)
{
	if (refReadLimit < inAmountToRead)
		return TwoLevelStatus(PDFHummus::eSuccess, PDFHummus::eFailure);
	EStatusCode status = ReadStreamToBuffer(inAmountToRead);
	if (status == PDFHummus::eSuccess)
		refReadLimit -= inAmountToRead;
	return TwoLevelStatus(status, PDFHummus::eSuccess);
}